

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

ItemFlags __thiscall QUrlModel::flags(QUrlModel *this,QModelIndex *index)

{
  uint uVar1;
  uint uVar2;
  QAbstractItemModel *pQVar3;
  QFlagsStorage<Qt::ItemFlag> QVar4;
  char cVar5;
  uint uVar6;
  QFlagsStorage<Qt::ItemFlag> QVar7;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = QStandardItemModel::flags((QModelIndex *)this);
  uVar1 = index->r;
  uVar2 = index->c;
  pQVar3 = (index->m).ptr;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
  }
  else {
    (**(code **)(*(long *)pQVar3 + 0x90))(&local_58,pQVar3,index,1);
  }
  QVar4.i = uVar6 & 0xfffffff5;
  if (pQVar3 == (QAbstractItemModel *)0x0) {
    QVar4.i = uVar6;
  }
  if ((int)(uVar1 | uVar2) < 0) {
    QVar4.i = uVar6;
  }
  cVar5 = ::QVariant::isNull();
  ::QVariant::~QVariant((QVariant *)&local_58);
  QVar7.i = QVar4.i & 0xffffffdf;
  if (cVar5 == '\0') {
    QVar7.i = QVar4.i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QFlagsStorageHelper<Qt::ItemFlag,_4>)(QFlagsStorageHelper<Qt::ItemFlag,_4>)QVar7.i;
  }
  __stack_chk_fail();
}

Assistant:

Qt::ItemFlags QUrlModel::flags(const QModelIndex &index) const
{
    Qt::ItemFlags flags = QStandardItemModel::flags(index);
    if (index.isValid()) {
        flags &= ~Qt::ItemIsEditable;
        // ### some future version could support "moving" urls onto a folder
        flags &= ~Qt::ItemIsDropEnabled;
    }

    if (index.data(Qt::DecorationRole).isNull())
        flags &= ~Qt::ItemIsEnabled;

    return flags;
}